

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O1

anon_class_32_4_5f7794cc * __thiscall
google::protobuf::internal::ExtensionSet::
ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(google::protobuf::MessageLite_const*,unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0>
          (anon_class_32_4_5f7794cc *__return_storage_ptr__,ExtensionSet *this,
          _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
          begin,_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                end,anon_class_32_4_5f7794cc func)

{
  uint8_t *puVar1;
  
  if ((_Base_ptr)this != begin._M_node) {
    do {
      puVar1 = Extension::InternalSerializeMessageSetItemWithCachedSizesToArray
                         ((Extension *)&((_Rb_tree_node_base *)((long)this + 0x20))->_M_parent,
                          func.extendee,func.extension_set,
                          ((_Rb_tree_node_base *)((long)this + 0x20))->_M_color,*func.target,
                          func.stream);
      *func.target = puVar1;
      this = (ExtensionSet *)std::_Rb_tree_increment((_Rb_tree_node_base *)this);
    } while ((_Base_ptr)this != begin._M_node);
  }
  __return_storage_ptr__->stream = func.stream;
  __return_storage_ptr__->extension_set = func.extension_set;
  __return_storage_ptr__->target = func.target;
  __return_storage_ptr__->extendee = func.extendee;
  return __return_storage_ptr__;
}

Assistant:

static KeyValueFunctor ForEach(Iterator begin, Iterator end,
                                 KeyValueFunctor func) {
    for (Iterator it = begin; it != end; ++it) func(it->first, it->second);
    return std::move(func);
  }